

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::FixedSizeBuffer::Serialize
          (FixedSizeBuffer *this,PartialBlockManager *partial_block_manager,idx_t available_segments
          ,idx_t segment_size,idx_t bitmask_offset)

{
  BufferHandle *this_00;
  BufferManager *pBVar1;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Var2;
  bool bVar3;
  uint uVar4;
  pointer pPVar5;
  data_ptr_t pdVar6;
  data_ptr_t __src;
  InternalException *this_01;
  BufferHandle dst_handle;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Stack_70;
  undefined1 local_68 [40];
  __uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_> _Stack_40;
  
  this_00 = &this->buffer_handle;
  bVar3 = BufferHandle::IsValid(this_00);
  if (bVar3) {
    if ((this->dirty != false) || ((this->block_pointer).block_id == -1)) {
      SetAllocationSize(this,available_segments,segment_size,bitmask_offset);
      if ((this->block_pointer).block_id != -1) {
        (*this->block_manager->_vptr_BlockManager[9])();
      }
      uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(this->allocation_size);
      PartialBlockManager::GetBlockAllocation
                ((PartialBlockAllocation *)local_98,partial_block_manager,uVar4);
      (this->block_pointer).block_id = local_88._0_8_;
      (this->block_pointer).offset = local_88._12_4_;
      if (_Stack_70._M_head_impl == (PartialBlock *)0x0) {
        make_uniq<duckdb::PartialBlockForIndex,duckdb::PartialBlockState&,duckdb::BlockManager&,duckdb::shared_ptr<duckdb::BlockHandle,true>&>
                  ((duckdb *)&dst_handle,(PartialBlockState *)local_88,this->block_manager,
                   &this->block_handle);
        _Var2._M_head_impl = _Stack_70._M_head_impl;
        _Stack_70._M_head_impl =
             (PartialBlock *)
             dst_handle.handle.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dst_handle.handle.internal.
        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        if ((element_type *)_Var2._M_head_impl != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::BlockHandle> *)
                       &(_Var2._M_head_impl)->_vptr_PartialBlock)->__weak_this_).internal.
                      super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
                    super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
          if (dst_handle.handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            (*(code *)((((dst_handle.handle.internal.
                          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.
                        internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.
                      internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
        }
      }
      else {
        pBVar1 = this->block_manager->buffer_manager;
        pPVar5 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
                 operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                             *)&_Stack_70);
        (*pBVar1->_vptr_BufferManager[7])(&dst_handle,pBVar1,&pPVar5->block_handle);
        pdVar6 = BufferHandle::Ptr(&dst_handle);
        uVar4 = (this->block_pointer).offset;
        __src = BufferHandle::Ptr(this_00);
        switchD_01939fa4::default(pdVar6 + uVar4,__src,this->allocation_size);
        BufferHandle::~BufferHandle(&dst_handle);
      }
      BufferHandle::Destroy(this_00);
      local_68._16_8_ = local_88._0_8_;
      local_68._0_8_ = local_98._0_8_;
      local_68._8_8_ = local_98._8_8_;
      local_68._32_8_ = local_88._16_8_;
      _Stack_40._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (tuple<duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
           (tuple<duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
           _Stack_70._M_head_impl;
      _Stack_70._M_head_impl = (PartialBlock *)0x0;
      PartialBlockManager::RegisterPartialBlock
                (partial_block_manager,(PartialBlockAllocation *)local_68);
      if ((_Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
          _Stack_40._M_t.
          super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
          .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl != (PartialBlock *)0x0)
      {
        (**(code **)(*(long *)_Stack_40._M_t.
                              super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
                              .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl + 8
                    ))();
      }
      _Stack_40._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (tuple<duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)0x0;
      BlockManager::RegisterBlock((BlockManager *)&dst_handle,(block_id_t)this->block_manager);
      shared_ptr<duckdb::BlockHandle,_true>::operator=(&this->block_handle,&dst_handle.handle);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dst_handle.handle.internal.
                  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      this->dirty = false;
      if (_Stack_70._M_head_impl != (PartialBlock *)0x0) {
        (*(_Stack_70._M_head_impl)->_vptr_PartialBlock[1])();
      }
    }
  }
  else if (((this->block_pointer).block_id == -1) || (this->dirty == true)) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_98,"invalid or missing buffer in FixedSizeAllocator",
               (allocator *)&dst_handle);
    InternalException::InternalException(this_01,(string *)local_98);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void FixedSizeBuffer::Serialize(PartialBlockManager &partial_block_manager, const idx_t available_segments,
                                const idx_t segment_size, const idx_t bitmask_offset) {

	// Early-out, if the block is already on disk and not in memory.
	if (!InMemory()) {
		if (!OnDisk() || dirty) {
			throw InternalException("invalid or missing buffer in FixedSizeAllocator");
		}
		return;
	}

	// Early-out, if the buffer is already on disk and not dirty.
	if (!dirty && OnDisk()) {
		return;
	}

	// Adjust the allocation size.
	D_ASSERT(segment_count != 0);
	SetAllocationSize(available_segments, segment_size, bitmask_offset);

	// the buffer is in memory, so we copied it onto a new buffer when pinning
	D_ASSERT(InMemory());
	if (OnDisk()) {
		block_manager.MarkBlockAsModified(block_pointer.block_id);
	}

	// now we write the changes, first get a partial block allocation
	PartialBlockAllocation allocation =
	    partial_block_manager.GetBlockAllocation(NumericCast<uint32_t>(allocation_size));
	block_pointer.block_id = allocation.state.block_id;
	block_pointer.offset = allocation.state.offset;

	auto &buffer_manager = block_manager.buffer_manager;

	if (allocation.partial_block) {
		// copy to an existing partial block
		D_ASSERT(block_pointer.offset > 0);
		auto &p_block_for_index = allocation.partial_block->Cast<PartialBlockForIndex>();
		auto dst_handle = buffer_manager.Pin(p_block_for_index.block_handle);
		memcpy(dst_handle.Ptr() + block_pointer.offset, buffer_handle.Ptr(), allocation_size);

	} else {
		// create a new block that can potentially be used as a partial block
		D_ASSERT(block_handle);
		D_ASSERT(!block_pointer.offset);
		auto p_block_for_index = make_uniq<PartialBlockForIndex>(allocation.state, block_manager, block_handle);
		allocation.partial_block = std::move(p_block_for_index);
	}

	// resetting this buffer
	buffer_handle.Destroy();

	// register the partial block
	partial_block_manager.RegisterPartialBlock(std::move(allocation));

	block_handle = block_manager.RegisterBlock(block_pointer.block_id);
	D_ASSERT(block_handle->BlockId() < MAXIMUM_BLOCK);

	// we persist any changes, so the buffer is no longer dirty
	dirty = false;
}